

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opts.h
# Opt level: O2

void __thiscall opts::BasicOption::output(BasicOption *this,ostream *out,int max_long)

{
  ostream *poVar1;
  char *pcVar2;
  int iVar3;
  
  std::operator<<(out,"   ");
  if (this->s == '\0') {
    pcVar2 = "    ";
    poVar1 = out;
  }
  else {
    poVar1 = std::operator<<(out,'-');
    poVar1 = std::operator<<(poVar1,this->s);
    pcVar2 = ", ";
  }
  std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(out,"--");
  poVar1 = std::operator<<(poVar1,(string *)&this->l);
  std::operator<<(poVar1,' ');
  if ((this->t)._M_string_length == 0) {
    iVar3 = 0;
  }
  else {
    std::operator<<(out,(string *)&this->t);
    iVar3 = (int)(this->t)._M_string_length;
  }
  iVar3 = (int)(this->l)._M_string_length + iVar3;
  while (iVar3 = iVar3 + 1, iVar3 < max_long) {
    std::operator<<(out,' ');
  }
  poVar1 = std::operator<<(out,"   ");
  std::operator<<(poVar1,(string *)&this->help);
  if ((this->d)._M_string_length != 0) {
    poVar1 = std::operator<<(out," [default: ");
    poVar1 = std::operator<<(poVar1,(string *)&this->d);
    std::operator<<(poVar1,"]");
  }
  std::operator<<(out,'\n');
  return;
}

Assistant:

void            output(std::ostream& out, int max_long) const
    {
        out << "   ";
        if (s)
            out << '-' << s << ", ";
        else
            out << "    ";

        out << "--" << l << ' ';

        if (!t.empty())
            out << t;

        for (int i = long_size(); i < max_long; ++i)
            out <<  ' ';

        out << "   " << help;

        if (!d.empty())
        {
            out << " [default: " << d << "]";
        }
        out << '\n';
    }